

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

__m256i * convolve_12taps(__m256i *s,__m256i *coeffs)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  __m256i *in_RAX;
  
  auVar1 = vpmaddwd_avx2((undefined1  [32])*s,(undefined1  [32])*coeffs);
  auVar2 = vpmaddwd_avx2((undefined1  [32])s[1],(undefined1  [32])coeffs[1]);
  auVar3 = vpmaddwd_avx2((undefined1  [32])s[2],(undefined1  [32])coeffs[2]);
  auVar4 = vpmaddwd_avx2((undefined1  [32])s[3],(undefined1  [32])coeffs[3]);
  auVar1 = vpaddd_avx2(auVar2,auVar1);
  auVar5 = vpmaddwd_avx2((undefined1  [32])s[4],(undefined1  [32])coeffs[4]);
  auVar2 = vpaddd_avx2(auVar3,auVar4);
  auVar3 = vpmaddwd_avx2((undefined1  [32])s[5],(undefined1  [32])coeffs[5]);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar2 = vpaddd_avx2(auVar5,auVar3);
  vpaddd_avx2(auVar1,auVar2);
  return in_RAX;
}

Assistant:

static inline __m256i convolve_12taps(const __m256i *const s,
                                      const __m256i *const coeffs) {
  const __m256i res_0 = _mm256_madd_epi16(s[0], coeffs[0]);
  const __m256i res_1 = _mm256_madd_epi16(s[1], coeffs[1]);
  const __m256i res_2 = _mm256_madd_epi16(s[2], coeffs[2]);
  const __m256i res_3 = _mm256_madd_epi16(s[3], coeffs[3]);
  const __m256i res_4 = _mm256_madd_epi16(s[4], coeffs[4]);
  const __m256i res_5 = _mm256_madd_epi16(s[5], coeffs[5]);

  const __m256i res1 = _mm256_add_epi32(_mm256_add_epi32(res_0, res_1),
                                        _mm256_add_epi32(res_2, res_3));
  const __m256i res = _mm256_add_epi32(_mm256_add_epi32(res_4, res_5), res1);

  return res;
}